

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FC_BPNN.cpp
# Opt level: O1

void __thiscall FC_BPNN::~FC_BPNN(FC_BPNN *this)

{
  Preceptron *this_00;
  pointer pmVar1;
  _Rb_tree_node_base *p_Var2;
  ulong uVar3;
  ulong uVar4;
  
  pmVar1 = (this->net).
           super__Vector_base<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->net).
      super__Vector_base<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pmVar1) {
    uVar4 = 0;
    do {
      for (p_Var2 = pmVar1[uVar4]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var2 != &pmVar1[uVar4]._M_t._M_impl.super__Rb_tree_header;
          p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
        this_00 = (Preceptron *)p_Var2[1]._M_parent;
        if (this_00 != (Preceptron *)0x0) {
          Preceptron::~Preceptron(this_00);
          operator_delete(this_00,0x98);
        }
        p_Var2[1]._M_parent = (_Base_ptr)0x0;
      }
      uVar4 = uVar4 + 1;
      pmVar1 = (this->net).
               super__Vector_base<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->net).
                     super__Vector_base<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pmVar1 >> 4) *
              -0x5555555555555555;
    } while (uVar4 <= uVar3 && uVar3 - uVar4 != 0);
  }
  std::
  vector<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
  ::~vector(&this->net);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&this->layers_error);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&this->layers_value);
  return;
}

Assistant:

FC_BPNN::~FC_BPNN()
{
	for (int i = 0; i < net.size(); i++) {
		for (auto& element : net[i]) {
			delete element.second;
			element.second = nullptr;
		}
	}
}